

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_print.c
# Opt level: O0

void glob_findinstance(t_pd *dummy,t_symbol *s)

{
  char *pcVar1;
  int iVar2;
  char *addr;
  long obj;
  t_symbol *s_local;
  t_pd *dummy_local;
  
  addr = (char *)0x0;
  if ((((s != (t_symbol *)0x0) && (s->s_name != (char *)0x0)) &&
      ((pcVar1 = s->s_name, *pcVar1 == '.' || (*pcVar1 == '0')))) &&
     ((obj = (long)s, s_local = (t_symbol *)dummy, iVar2 = __isoc99_sscanf(pcVar1 + 1,"x%lx",&addr),
      iVar2 != 0 && (addr != (char *)0x0)))) {
    canvas_finderror(addr);
  }
  return;
}

Assistant:

void glob_findinstance(t_pd *dummy, t_symbol*s)
{
    // revert s to (potential) pointer to object
    PD_LONGINTTYPE obj = 0;
    const char*addr;
    if(!s || !s->s_name)
        return;
    addr = s->s_name;
    if (('.' != addr[0]) && ('0' != addr[0]))
        return;
    if (!sscanf(addr+1, "x%lx", &obj))
        return;

    if(!obj)
        return;

    canvas_finderror((void *)obj);
}